

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O0

void __thiscall stateObservation::tools::Logger::clearLogs(Logger *this)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_20;
  _Self local_18;
  iterator i;
  Logger *this_local;
  
  i._M_node = (_Base_ptr)this;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<const_void_*,_stateObservation::tools::Logger::log_s,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_stateObservation::tools::Logger::log_s>_>_>
       ::begin(&this->logs_);
  while( true ) {
    local_20._M_node =
         (_Base_ptr)
         std::
         map<const_void_*,_stateObservation::tools::Logger::log_s,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_stateObservation::tools::Logger::log_s>_>_>
         ::end(&this->logs_);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_void_*const,_stateObservation::tools::Logger::log_s>_>
             ::operator->(&local_18);
    IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::clear((IndexedMatrixArrayT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
             *)&ppVar2->second);
    std::_Rb_tree_iterator<std::pair<const_void_*const,_stateObservation::tools::Logger::log_s>_>::
    operator++(&local_18);
  }
  return;
}

Assistant:

void Logger::clearLogs()
{
  for(std::map<const void *, log_s>::iterator i = logs_.begin(); i != logs_.end(); ++i)
  {
    i->second.array.clear();
  }
}